

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv_bigint.cc
# Opt level: O2

int __thiscall
absl::strings_internal::BigUnsigned<84>::ReadDigits
          (BigUnsigned<84> *this,char *begin,char *end,int significant_digits)

{
  char cVar1;
  char cVar2;
  int iVar3;
  byte bVar4;
  uint32_t value;
  char *pcVar5;
  char *pcVar6;
  ulong uVar7;
  int iVar8;
  
  if (0x32a < significant_digits) {
    __assert_fail("significant_digits <= Digits10() + 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/internal/charconv_bigint.cc"
                  ,0xc3,
                  "int absl::strings_internal::BigUnsigned<84>::ReadDigits(const char *, const char *, int) [max_words = 84]"
                 );
  }
  SetToZero(this);
  uVar7 = (ulong)begin & 0xffffffff;
  for (; (begin < end && (*begin == '0')); begin = begin + 1) {
    uVar7 = (ulong)((int)uVar7 + 1);
  }
  pcVar5 = end + -1;
  iVar8 = 0;
  do {
    pcVar6 = pcVar5 + 1;
    if (pcVar6 <= begin) {
LAB_00245d48:
      if (iVar8 == 0) {
        iVar3 = 0;
      }
      else {
        pcVar5 = std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                           (begin,pcVar6);
        iVar3 = 0;
        if (pcVar6 == pcVar5) {
          iVar3 = iVar8;
        }
      }
LAB_00245d72:
      bVar4 = 0;
      value = 0;
      iVar8 = 0;
      while ((begin != pcVar6 && (0 < significant_digits))) {
        cVar1 = *begin;
        if (cVar1 == '.') {
          bVar4 = 1;
        }
        else {
          cVar2 = cVar1 + -0x30;
          significant_digits = significant_digits + -1;
          if ((begin + 1 != pcVar6 && significant_digits == 0) && ((cVar1 == '5' || (cVar1 == '0')))
             ) {
            cVar2 = cVar1 + -0x2f;
          }
          iVar3 = iVar3 - (uint)bVar4;
          value = (int)cVar2 + value * 10;
          iVar8 = iVar8 + 1;
          if (iVar8 == 9) {
            MultiplyBy(this,1000000000);
            iVar8 = 0;
            AddWithCarry(this,0,value);
            value = 0;
          }
        }
        begin = begin + 1;
        uVar7 = (ulong)((int)uVar7 + 1);
      }
      if (iVar8 != 0) {
        MultiplyBy(this,(&kTenToNth)[iVar8]);
        AddWithCarry(this,0,value);
      }
      if ((begin < pcVar6) && (bVar4 == 0)) {
        pcVar5 = std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                           (begin,pcVar6);
        iVar3 = ((int)pcVar5 + iVar3) - (int)uVar7;
      }
      return iVar3;
    }
    if (*pcVar5 != '0') {
      if (*pcVar5 == '.') {
        iVar3 = 0;
        for (pcVar6 = pcVar5; (begin < pcVar6 && (pcVar6[-1] == '0')); pcVar6 = pcVar6 + -1) {
          iVar3 = iVar3 + 1;
        }
        goto LAB_00245d72;
      }
      goto LAB_00245d48;
    }
    iVar8 = iVar8 + 1;
    pcVar5 = pcVar5 + -1;
  } while( true );
}

Assistant:

int BigUnsigned<max_words>::ReadDigits(const char* begin, const char* end,
                                       int significant_digits) {
  assert(significant_digits <= Digits10() + 1);
  SetToZero();

  bool after_decimal_point = false;
  // Discard any leading zeroes before the decimal point
  while (begin < end && *begin == '0') {
    ++begin;
  }
  int dropped_digits = 0;
  // Discard any trailing zeroes.  These may or may not be after the decimal
  // point.
  while (begin < end && *std::prev(end) == '0') {
    --end;
    ++dropped_digits;
  }
  if (begin < end && *std::prev(end) == '.') {
    // If the string ends in '.', either before or after dropping zeroes, then
    // drop the decimal point and look for more digits to drop.
    dropped_digits = 0;
    --end;
    while (begin < end && *std::prev(end) == '0') {
      --end;
      ++dropped_digits;
    }
  } else if (dropped_digits) {
    // We dropped digits, and aren't sure if they're before or after the decimal
    // point.  Figure that out now.
    const char* dp = std::find(begin, end, '.');
    if (dp != end) {
      // The dropped trailing digits were after the decimal point, so don't
      // count them.
      dropped_digits = 0;
    }
  }
  // Any non-fraction digits we dropped need to be accounted for in our exponent
  // adjustment.
  int exponent_adjust = dropped_digits;

  uint32_t queued = 0;
  int digits_queued = 0;
  for (; begin != end && significant_digits > 0; ++begin) {
    if (*begin == '.') {
      after_decimal_point = true;
      continue;
    }
    if (after_decimal_point) {
      // For each fractional digit we emit in our parsed integer, adjust our
      // decimal exponent to compensate.
      --exponent_adjust;
    }
    char digit = (*begin - '0');
    --significant_digits;
    if (significant_digits == 0 && std::next(begin) != end &&
        (digit == 0 || digit == 5)) {
      // If this is the very last significant digit, but insignificant digits
      // remain, we know that the last of those remaining significant digits is
      // nonzero.  (If it wasn't, we would have stripped it before we got here.)
      // So if this final digit is a 0 or 5, adjust it upward by 1.
      //
      // This adjustment is what allows incredibly large mantissas ending in
      // 500000...000000000001 to correctly round up, rather than to nearest.
      ++digit;
    }
    queued = 10 * queued + static_cast<uint32_t>(digit);
    ++digits_queued;
    if (digits_queued == kMaxSmallPowerOfTen) {
      MultiplyBy(kTenToNth[kMaxSmallPowerOfTen]);
      AddWithCarry(0, queued);
      queued = digits_queued = 0;
    }
  }
  // Encode any remaining digits.
  if (digits_queued) {
    MultiplyBy(kTenToNth[digits_queued]);
    AddWithCarry(0, queued);
  }

  // If any insignificant digits remain, we will drop them.  But if we have not
  // yet read the decimal point, then we have to adjust the exponent to account
  // for the dropped digits.
  if (begin < end && !after_decimal_point) {
    // This call to std::find will result in a pointer either to the decimal
    // point, or to the end of our buffer if there was none.
    //
    // Either way, [begin, decimal_point) will contain the set of dropped digits
    // that require an exponent adjustment.
    const char* decimal_point = std::find(begin, end, '.');
    exponent_adjust += (decimal_point - begin);
  }
  return exponent_adjust;
}